

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::DescriptorTest_FindFieldByNumber_Test::TestBody
          (DescriptorTest_FindFieldByNumber_Test *this)

{
  bool bVar1;
  char *pcVar2;
  FieldDescriptor *pFVar3;
  char *in_R9;
  string local_258;
  AssertHelper local_238;
  Message local_230;
  bool local_221;
  undefined1 local_220 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_1f0;
  Message local_1e8;
  bool local_1d9;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar__2;
  Message local_1c0;
  FieldDescriptor *local_1b8;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_6;
  Message local_198;
  FieldDescriptor *local_190;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_5;
  Message local_170;
  FieldDescriptor *local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_130;
  Message local_128;
  bool local_119;
  undefined1 local_118 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_e8;
  Message local_e0;
  bool local_d1;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_;
  Message local_b8;
  FieldDescriptor *local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_3;
  Message local_90;
  FieldDescriptor *local_88;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_2;
  Message local_68;
  FieldDescriptor *local_60;
  undefined1 local_58 [8];
  AssertionResult gtest_ar_1;
  Message local_40 [3];
  FieldDescriptor *local_28;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  DescriptorTest_FindFieldByNumber_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_28 = Descriptor::FindFieldByNumber((this->super_DescriptorTest).message_,1);
  testing::internal::EqHelper::
  Compare<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*,_nullptr>
            ((EqHelper *)local_20,"foo_","message_->FindFieldByNumber(1)",
             &(this->super_DescriptorTest).foo_,&local_28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x443,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_60 = Descriptor::FindFieldByNumber((this->super_DescriptorTest).message_,6);
  testing::internal::EqHelper::
  Compare<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*,_nullptr>
            ((EqHelper *)local_58,"bar_","message_->FindFieldByNumber(6)",
             &(this->super_DescriptorTest).bar_,&local_60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x444,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  local_88 = Descriptor::FindFieldByNumber((this->super_DescriptorTest).message_,500000000);
  testing::internal::EqHelper::
  Compare<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*,_nullptr>
            ((EqHelper *)local_80,"baz_","message_->FindFieldByNumber(500000000)",
             &(this->super_DescriptorTest).baz_,&local_88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x445,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_b0 = Descriptor::FindFieldByNumber((this->super_DescriptorTest).message_,0xf);
  testing::internal::EqHelper::
  Compare<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*,_nullptr>
            ((EqHelper *)local_a8,"moo_","message_->FindFieldByNumber(15)",
             &(this->super_DescriptorTest).moo_,&local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x446,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  pFVar3 = Descriptor::FindFieldByNumber((this->super_DescriptorTest).message_,0xcc7d8);
  local_d1 = pFVar3 == (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_d0,&local_d1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_d0,
               (AssertionResult *)"message_->FindFieldByNumber(837592) == nullptr","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x447,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  pFVar3 = Descriptor::FindFieldByNumber((this->super_DescriptorTest).message_,2);
  local_119 = pFVar3 == (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_118,&local_119,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_4.message_,(internal *)local_118,
               (AssertionResult *)"message_->FindFieldByNumber(2) == nullptr","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x448,pcVar2);
    testing::internal::AssertHelper::operator=(&local_130,&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  local_168 = Descriptor::FindFieldByNumber((this->super_DescriptorTest).message2_,1);
  testing::internal::EqHelper::
  Compare<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*,_nullptr>
            ((EqHelper *)local_160,"foo2_","message2_->FindFieldByNumber(1)",
             &(this->super_DescriptorTest).foo2_,&local_168);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x44a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  local_190 = Descriptor::FindFieldByNumber((this->super_DescriptorTest).message2_,2);
  testing::internal::EqHelper::
  Compare<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*,_nullptr>
            ((EqHelper *)local_188,"bar2_","message2_->FindFieldByNumber(2)",
             &(this->super_DescriptorTest).bar2_,&local_190);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,1099,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  local_1b8 = Descriptor::FindFieldByNumber((this->super_DescriptorTest).message2_,6);
  testing::internal::EqHelper::
  Compare<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*,_nullptr>
            ((EqHelper *)local_1b0,"mooo2_","message2_->FindFieldByNumber(6)",
             &(this->super_DescriptorTest).mooo2_,&local_1b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x44c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  pFVar3 = Descriptor::FindFieldByNumber((this->super_DescriptorTest).message2_,0xf);
  local_1d9 = pFVar3 == (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1d8,&local_1d9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_1d8,
               (AssertionResult *)"message2_->FindFieldByNumber(15) == nullptr","false","true",in_R9
              );
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x44d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  pFVar3 = Descriptor::FindFieldByNumber((this->super_DescriptorTest).message2_,500000000);
  local_221 = pFVar3 == (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_220,&local_221,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_258,(internal *)local_220,
               (AssertionResult *)"message2_->FindFieldByNumber(500000000) == nullptr","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x44e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_238,&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  return;
}

Assistant:

TEST_F(DescriptorTest, FindFieldByNumber) {
  EXPECT_EQ(foo_, message_->FindFieldByNumber(1));
  EXPECT_EQ(bar_, message_->FindFieldByNumber(6));
  EXPECT_EQ(baz_, message_->FindFieldByNumber(500000000));
  EXPECT_EQ(moo_, message_->FindFieldByNumber(15));
  EXPECT_TRUE(message_->FindFieldByNumber(837592) == nullptr);
  EXPECT_TRUE(message_->FindFieldByNumber(2) == nullptr);

  EXPECT_EQ(foo2_, message2_->FindFieldByNumber(1));
  EXPECT_EQ(bar2_, message2_->FindFieldByNumber(2));
  EXPECT_EQ(mooo2_, message2_->FindFieldByNumber(6));
  EXPECT_TRUE(message2_->FindFieldByNumber(15) == nullptr);
  EXPECT_TRUE(message2_->FindFieldByNumber(500000000) == nullptr);
}